

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O2

void __thiscall
andyzip::brotli_decoder::read_huffman_code<andyzip::huffman_table<258>>
          (brotli_decoder *this,brotli_decoder_state *s,huffman_table<258> *table,int alphabet_size)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  ssize_t sVar5;
  ssize_t sVar6;
  int iVar7;
  undefined4 in_register_0000000c;
  size_t __nbytes;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *extraout_RDX_00;
  int i;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint local_2bc;
  huffman_table<18> complex_table;
  uint16_t symbols [258];
  
  __nbytes = CONCAT44(in_register_0000000c,alphabet_size);
  sVar5 = brotli_decoder_state::read((brotli_decoder_state *)this,2,table,__nbytes);
  if (*(int *)(this + 0x28) == 0) {
    uVar8 = (uint)table & 0x3ff;
    if ((int)sVar5 == 1) {
      sVar5 = brotli_decoder_state::read((brotli_decoder_state *)this,2,__buf,__nbytes);
      uVar15 = (int)sVar5 + 1;
      iVar3 = log2_floor(uVar8 - 1);
      __buf_00 = extraout_RDX;
      for (uVar9 = 0; uVar15 != uVar9; uVar9 = uVar9 + 1) {
        sVar6 = brotli_decoder_state::read((brotli_decoder_state *)this,iVar3,__buf_00,__nbytes);
        symbols[uVar9] = (uint16_t)sVar6;
        __buf_00 = extraout_RDX_00;
      }
      iVar3 = 0;
      if (uVar15 == 4) {
        sVar6 = brotli_decoder_state::read((brotli_decoder_state *)this,1,__buf_00,__nbytes);
        iVar3 = (int)sVar6;
      }
      huffman_table<258>::init
                ((huffman_table<258> *)s,
                 (EVP_PKEY_CTX *)
                 (read_huffman_code<andyzip::huffman_table<258>_>::simple_lengths +
                 (iVar3 + (int)sVar5)));
    }
    else {
      symbols[8] = 0;
      symbols[0] = 0;
      symbols[1] = 0;
      symbols[2] = 0;
      symbols[3] = 0;
      symbols[4] = 0;
      symbols[5] = 0;
      symbols[6] = 0;
      symbols[7] = 0;
      lVar14 = *(long *)(this + 8);
      uVar15 = *(uint *)(this + 0x10);
      iVar3 = 0;
      iVar11 = 0;
      for (lVar13 = (long)(int)sVar5; lVar13 != 0x12; lVar13 = lVar13 + 1) {
        uVar16 = *(uint *)(lVar14 + (ulong)(uVar15 >> 3)) >> ((byte)uVar15 & 7) & 0xf;
        uVar15 = uVar15 + "\x02\x02\x02\x03\x02\x02\x02\x04\x02\x02\x02\x03\x02\x02\x02\x04"[uVar16]
        ;
        *(uint *)(this + 0x10) = uVar15;
        bVar1 = ""[uVar16];
        *(byte *)((long)symbols + (ulong)"\x01\x02\x03\x04"[lVar13]) = bVar1;
        if ((0x1111U >> uVar16 & 1) == 0) {
          iVar3 = iVar3 + 1;
          iVar11 = iVar11 + (0x20U >> (bVar1 & 0x1f));
          if (0x1f < iVar11) break;
        }
      }
      if (((iVar3 == 1) || (iVar11 == 0x20)) &&
         (huffman_table<18>::init(&complex_table,(EVP_PKEY_CTX *)symbols),
         complex_table.invalid_ == false)) {
        local_2bc = 8;
        iVar3 = 0;
        uVar15 = 0;
        iVar11 = 0;
        do {
          iVar10 = 0;
          while( true ) {
            lVar14 = (long)iVar11;
            if ((uVar8 - iVar11 == 0 || (int)uVar8 < iVar11) || (0x7fff < iVar3)) {
              if (iVar3 < 0x8001) {
                memset((void *)((long)symbols + lVar14),0,(long)(int)(uVar8 - iVar11));
                huffman_table<258>::init((huffman_table<258> *)s,(EVP_PKEY_CTX *)symbols);
                if (s->literal_context_map[0xee] != '\x01') {
                  return;
                }
              }
              goto LAB_00105604;
            }
            uVar16 = *(uint *)(this + 0x10);
            iVar4 = 1 - uVar16;
            uVar16 = *(uint *)(*(long *)(this + 8) + (ulong)(uVar16 >> 3)) >> ((byte)uVar16 & 7);
            iVar7 = -0x11;
            do {
              uVar12 = iVar7 + 0x11;
              iVar4 = iVar4 + -1;
              iVar7 = iVar7 + 1;
            } while (complex_table.limits_[uVar12] <
                     CONCAT11(rev16(unsigned_short)::BitReverseTable256[uVar16 & 0xff],
                              rev16(unsigned_short)::BitReverseTable256[uVar16 >> 8 & 0xff]));
            uVar2 = complex_table.symbols_
                    [(uint)(ushort)(CONCAT11(rev16(unsigned_short)::BitReverseTable256
                                             [uVar16 & 0xff],
                                             rev16(unsigned_short)::BitReverseTable256
                                             [uVar16 >> 8 & 0xff]) >>
                                   (-((char)iVar7 + complex_table.min_length_) & 0x1f)) -
                     (uint)complex_table.base_[uVar12]];
            *(uint *)(this + 0x10) = (uint)complex_table.min_length_ - iVar4;
            uVar16 = (uint)uVar2;
            if (uVar2 < 0x10) break;
            uVar12 = 0;
            if (uVar16 == 0x10) {
              uVar12 = local_2bc;
            }
            uVar16 = uVar16 == 0x10 ^ 3;
            iVar4 = brotli_decoder_state::peek((brotli_decoder_state *)this,uVar16);
            *(uint *)(this + 0x10) = *(int *)(this + 0x10) + uVar16;
            iVar7 = iVar10;
            if (uVar15 != uVar12) {
              iVar7 = 0;
            }
            iVar10 = iVar7 + -2 << (sbyte)uVar16;
            if (iVar7 < 1) {
              iVar10 = iVar7;
            }
            iVar10 = iVar10 + iVar4 + 3;
            iVar7 = iVar10 - iVar7;
            if ((int)uVar8 < iVar7 + iVar11) goto LAB_00105604;
            lVar13 = 0;
            while( true ) {
              if (iVar7 == (int)lVar13) break;
              *(byte *)((long)symbols + lVar13 + lVar14) = (byte)uVar12;
              lVar13 = lVar13 + 1;
            }
            iVar11 = iVar11 + (int)lVar13;
            iVar7 = iVar7 * (0x8000U >> ((byte)uVar12 & 0x1f));
            if (uVar12 == 0) {
              iVar7 = 0;
            }
            iVar3 = iVar7 + iVar3;
            uVar15 = uVar12;
          }
          *(byte *)((long)symbols + lVar14) = (byte)uVar2;
          uVar12 = 0x8000 >> ((byte)uVar2 & 0x1f);
          if (uVar2 == 0) {
            uVar12 = uVar16;
          }
          iVar11 = iVar11 + 1;
          if (uVar2 != 0) {
            local_2bc = uVar16;
          }
          iVar3 = iVar3 + uVar12;
        } while( true );
      }
LAB_00105604:
      *(undefined4 *)(this + 0x28) = 4;
    }
  }
  return;
}

Assistant:

static void read_huffman_code(brotli_decoder_state &s, Table &table, int alphabet_size) {
      int code_type = s.read(2);
      if (s.error != error_code::ok) return;
      alphabet_size &= 1023;
      if (debug) fprintf(s.log_file, "[ReadHuffmanCode] s->sub_loop_counter = %d\n", code_type);
      if (code_type == 1) {
        // 3.4.  Simple Prefix Codes
        int num_symbols = s.read(2) + 1;
        int alphabet_bits = log2_floor(alphabet_size - 1);
        uint16_t symbols[Table::max_codes];
        for (int i = 0; i != num_symbols; ++i) {
          symbols[i] = (uint16_t)s.read(alphabet_bits);
          if (debug) fprintf(s.log_file, "[ReadSimpleHuffmanSymbols] s->symbols_lists_array[i] = %d\n", symbols[i]);
        }
        if (debug) fprintf(s.log_file, "[ReadHuffmanCode] s->symbol = %d\n", num_symbols-1);
        static const uint8_t simple_lengths[][4] = {
          {0},
          {1, 1},
          {1, 2, 2},
          {2, 2, 2, 2},
          {1, 2, 3, 3},
        };
        int tree_select = num_symbols == 4 ? s.read(1) : 0;
        table.init(simple_lengths[num_symbols - 1 + tree_select], symbols, num_symbols);
      } else {
        // 3.5.  Complex Prefix Codes
        andyzip::huffman_table<18> complex_table;
        {
          uint8_t lengths[18] = {0};
          int space = 0;
          int num_codes = 0;
          for (int i = code_type; i != 18; ++i) {
            int bits = s.peek(4);
            if (s.error != error_code::ok) return;

            static const uint8_t kCodeLengthCodeOrder[18] = {
              1, 2, 3, 4, 0, 5, 17, 6, 16, 7, 8, 9, 10, 11, 12, 13, 14, 15,
            };

            // Static prefix code for the complex code length code lengths.
            static const uint8_t kCodeLengthPrefixLength[16] = {
              2, 2, 2, 3, 2, 2, 2, 4, 2, 2, 2, 3, 2, 2, 2, 4,
            };

            static const uint8_t kCodeLengthPrefixValue[16] = {
              0, 4, 3, 2, 0, 4, 3, 1, 0, 4, 3, 2, 0, 4, 3, 5,
            };

            s.drop(kCodeLengthPrefixLength[bits]);
            uint8_t length = kCodeLengthPrefixValue[bits];
            lengths[kCodeLengthCodeOrder[i]] = length;
            if (debug) fprintf(s.log_file, "[ReadCodeLengthCodeLengths] s->code_length_code_lengths[%d] = %d\n", kCodeLengthCodeOrder[i], lengths[kCodeLengthCodeOrder[i]]);
            if (length) {
              ++num_codes;
              space += 32 >> length;
              if (space >= 32) break;
            }
          }
          if (num_codes != 1 && space != 32) {
            if (debug) fprintf(s.log_file, "bad\n");
            s.error = error_code::huffman_length_error;
            return;
          }

          complex_table.init(lengths, nullptr, 18);
          if (complex_table.invalid()) {
            if (debug) fprintf(s.log_file, "bad2\n");
            s.error = error_code::huffman_length_error;
            return;
          }
        }

        {
          int space = 0;
          uint8_t lengths[Table::max_codes];
          uint8_t nzcl = 8;
          int prev_code_len = 8;
          int repeat = 0;
          int repeat_code_len = 0;
          int i = 0;
          for(; i < alphabet_size && space < 32768;) {
            auto code = complex_table.decode(s.peek(16));
            s.drop(code.first);
            int code_len = code.second;
            if (code_len < 16) {
              if (code_len) {
                if (debug) fprintf(s.log_file, "[ReadHuffmanCode] code_length[%d] = %d\n", i, code_len);
              }
              if (i + 1 > alphabet_size) {
                s.error = error_code::huffman_length_error;
                if (debug) fprintf(s.log_file, "bad3\n");
                return;
              }
              lengths[i++] = (uint8_t)code_len;
              if (code_len) {
                space += 32768 >> code_len;
                prev_code_len = code_len;
              }
              repeat = 0;
            } else {
              int extra_bits = code_len == 16 ? 2 : 3;
              int new_len = code_len == 16 ? prev_code_len : 0;
              int repeat_delta = s.peek(extra_bits);
              s.drop(extra_bits);

              if (repeat_code_len != new_len) {
                repeat = 0;
                repeat_code_len = new_len;
              }

              int old_repeat = repeat;
              if (repeat > 0) {
                repeat -= 2;
                repeat <<= extra_bits;
              }

              repeat += repeat_delta + 3;
              repeat_delta = repeat - old_repeat;

              if (debug) fprintf(s.log_file, "[ReadHuffmanCode] code_length[%d..%d] = %d\n", i, i + repeat_delta - 1, new_len);
              if (i + repeat_delta > alphabet_size) {
                if (debug) fprintf(s.log_file, "bad4 %d %d %d\n", i, repeat_delta, alphabet_size);
                s.error = error_code::huffman_length_error;
                return;
              }
              for (int j = 0; j != repeat_delta; ++j) {
                lengths[i++] = new_len;
              }
              if (new_len) {
                space += (32768 >> new_len) * repeat_delta;
              }
            }
          }
          if (space > 32768) {
            if (debug) fprintf(s.log_file, "bad5\n");
            s.error = error_code::huffman_length_error;
            return;
          }
          memset(lengths + i, 0, alphabet_size - i);
          table.init(lengths, nullptr, alphabet_size);
          if (table.invalid()) {
            if (debug) fprintf(s.log_file, "bad6\n");
            s.error = error_code::huffman_length_error;
            return;
          }
        }
      }
    }